

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QPlatformScreen_*>::relocate
          (QArrayDataPointer<QPlatformScreen_*> *this,qsizetype offset,QPlatformScreen ***data)

{
  bool bVar1;
  long *in_RDX;
  long in_RSI;
  QArrayDataPointer<QPlatformScreen_*> *in_RDI;
  QPlatformScreen ***unaff_retaddr;
  QPlatformScreen **res;
  QPlatformScreen **first;
  QArrayDataPointer<QPlatformScreen_*> *c;
  
  first = in_RDI->ptr + in_RSI;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<QPlatformScreen*,long_long>
            (first,(longlong)in_RDI,(QPlatformScreen **)0x13d067);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<QPlatformScreen*>,QPlatformScreen*const*>
                        (unaff_retaddr,c), bVar1)) {
    *in_RDX = in_RSI * 8 + *in_RDX;
  }
  in_RDI->ptr = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }